

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

char * PHYSFS_getLastError(void)

{
  PHYSFS_ErrorCode code;
  char *pcVar1;
  
  code = PHYSFS_getLastErrorCode();
  if (code != PHYSFS_ERR_OK) {
    pcVar1 = PHYSFS_getErrorByCode(code);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

const char *PHYSFS_getLastError(void)
{
    const PHYSFS_ErrorCode err = PHYSFS_getLastErrorCode();
    return (err) ? PHYSFS_getErrorByCode(err) : NULL;
}